

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseCapabilities(Parser *this)

{
  bool bVar1;
  uint uVar2;
  Parser *in_RSI;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var3;
  bool isconstant;
  bool isinline;
  bool isunused;
  undefined1 local_8e [2];
  undefined1 local_8c [4];
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> local_88;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_80;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ensures;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  requires;
  undefined1 local_40 [16];
  
  isunused = false;
  isinline = false;
  isconstant = false;
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  requires.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ensures.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ensures.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ensures.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
       (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)this;
  while (((bVar1 = Token::operator==(in_RSI->lexer->currentToken,TOK_ENSURE), bVar1 ||
          (bVar1 = Token::operator==(in_RSI->lexer->currentToken,TOK_DIRECTIVE), bVar1)) &&
         (bVar1 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), bVar1))) {
    bVar1 = Token::operator==(in_RSI->lexer->currentToken,TOK_ENSURE);
    if (bVar1) {
      parseCapabilityEnsure(in_RSI,&requires,&ensures);
    }
    else {
      parseCapabilityDirective(in_RSI,&isunused,&isinline,&isconstant);
    }
    bVar1 = expect(in_RSI,TOK_EOL);
    if (!bVar1) {
      local_8e = (undefined1  [2])0x2;
      local_8c = (undefined1  [4])0xf;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_8c + 4),(SyntaxErrorCode *)local_8e,(Position *)local_8c);
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_8c + 4));
      skipToEol(in_RSI);
    }
    while (bVar1 = Token::operator==(in_RSI->lexer->currentToken,TOK_EOL), bVar1) {
      Lexer::next(in_RSI->lexer);
    }
  }
  uVar2 = (uint)in_RSI->lexer->currentToken->type;
  if ((uVar2 < 0x1c) && ((0xd200000U >> (uVar2 & 0x1f) & 1) != 0)) {
    std::
    make_unique<pfederc::Capabilities,bool&,bool&,bool&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
              ((bool *)(local_8c + 4),&isunused,&isinline,
               (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&isconstant,&requires);
    _Var3._M_head_impl =
         (Expr *)local_80._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    parsePrimary((Parser *)
                 local_80._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,
                 (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                 in_RSI);
    std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::~unique_ptr
              ((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               (local_8c + 4));
  }
  else {
    local_8e = (undefined1  [2])0x2;
    local_8c = (undefined1  [4])0x29;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_8c + 4),(SyntaxErrorCode *)local_8e,(Position *)local_8c);
    _Var3._M_head_impl = (Expr *)local_80;
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_8c + 4));
    (_Var3._M_head_impl)->_vptr_Expr = 0;
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&ensures);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&requires);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)_Var3._M_head_impl;
}

Assistant:

std::unique_ptr<Expr> Parser::parseCapabilities() noexcept {
  bool isunused = false, isinline = false, isconstant = false;
  std::vector<std::unique_ptr<Expr>> requires;
  std::vector<std::unique_ptr<Expr>> ensures;

  while ((*lexer.getCurrentToken() == TokenType::TOK_ENSURE
      || *lexer.getCurrentToken() == TokenType::TOK_DIRECTIVE)
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {

    if (*lexer.getCurrentToken() == TokenType::TOK_ENSURE)
      parseCapabilityEnsure(requires, ensures);
    else
      parseCapabilityDirective(isunused, isinline, isconstant);

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToEol();
    }

    // skip new lines
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();
  }

  switch (lexer.getCurrentToken()->getType()) {
  case TokenType::TOK_KW_CLASS:
  case TokenType::TOK_KW_FN:
  case TokenType::TOK_KW_TRAIT:
  case TokenType::TOK_KW_TYPE:
    return parsePrimary(std::make_unique<Capabilities>(
          isunused, isinline, isconstant,
          std::move(requires), std::move(ensures)));
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_FOLLOWUP,
          lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }
}